

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void doc_compression_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffff9b8;
  fdb_file_handle *in_stack_fffffffffffff9c0;
  fdb_doc **in_stack_fffffffffffff9c8;
  void *in_stack_fffffffffffff9d0;
  fdb_doc **in_stack_fffffffffffff9d8;
  size_t in_stack_fffffffffffff9e0;
  fdb_doc *in_stack_fffffffffffffa10;
  fdb_kvs_handle *in_stack_fffffffffffffa18;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char temp [256];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int dummy_len;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._1_1_ = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.wal_threshold._4_4_ = 1;
  fdb_open((fdb_file_handle **)temp._120_8_,(char *)temp._112_8_,(fdb_config *)temp._104_8_);
  fdb_kvs_open_default
            (in_stack_fffffffffffff9c0,(fdb_kvs_handle **)in_stack_fffffffffffff9b8,
             (fdb_kvs_config *)0x1152f2);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"doc_compression_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,2999);
    doc_compression_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,2999,"void doc_compression_test()");
    }
  }
  pvVar3 = (void *)0x115387;
  memset(&fconfig.num_blocks_readahead,0x61,0x20);
  temp[0x18] = '\0';
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(temp + 0xf8,"body%d_%s",(ulong)(uint)n,&fconfig.num_blocks_readahead);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x115467;
    metalen = strlen(temp + 0xf8);
    fdb_doc_create(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                   (size_t)in_stack_fffffffffffff9b8,pvVar3,metalen,(void *)0x11549e,
                   in_stack_fffffffffffff9e0);
    pvVar3 = (void *)0x1154b7;
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff9b8 + (long)n * 8));
  }
  fdb_doc_create(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                 (size_t)in_stack_fffffffffffff9b8,pvVar3,0,(void *)0x11550e,
                 in_stack_fffffffffffff9e0);
  fVar1 = fdb_del(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xbca);
    doc_compression_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xbca,"void doc_compression_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x115591);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9b8,'\0');
  fdb_kvs_close(in_stack_fffffffffffff9b8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff9b8);
  fdb_open((fdb_file_handle **)temp._120_8_,(char *)temp._112_8_,(fdb_config *)temp._104_8_);
  fdb_kvs_open_default
            (in_stack_fffffffffffff9c0,(fdb_kvs_handle **)in_stack_fffffffffffff9b8,
             (fdb_kvs_config *)0x1155e1);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"doc_compression_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xbda);
    doc_compression_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xbda,"void doc_compression_test()");
    }
  }
  memset(&fconfig.num_blocks_readahead,0x62,0x40);
  temp[0x38] = '\0';
  for (n = 0; n < 2; n = n + 1) {
    sprintf(bodybuf + 0xf8,"newmeta%d",(ulong)(uint)n);
    sprintf(temp + 0xf8,"newbody%d_%s",(ulong)(uint)n,&fconfig.num_blocks_readahead);
    strlen(bodybuf + 0xf8);
    strlen(temp + 0xf8);
    fdb_doc_update(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   (size_t)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                   (size_t)in_stack_fffffffffffff9b8);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff9b8 + (long)n * 8));
  }
  pvVar3 = (void *)0x115774;
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9b8,'\0');
  n = 0;
  do {
    if (9 < n) {
      pvVar3 = (void *)0x115a00;
      fdb_compact(in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
      n = 0;
      do {
        if (9 < n) {
          for (n = 0; n < 10; n = n + 1) {
            fdb_doc_free((fdb_doc *)0x115c9c);
          }
          fdb_kvs_close(in_stack_fffffffffffff9b8);
          fdb_close((fdb_file_handle *)in_stack_fffffffffffff9b8);
          fdb_shutdown();
          memleak_end();
          if (doc_compression_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","document compression test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","document compression test");
          }
          return;
        }
        fdb_doc_create(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                       (size_t)in_stack_fffffffffffff9b8,pvVar3,0,(void *)0x115a52,
                       in_stack_fffffffffffff9e0);
        fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
        if (n == 5) {
          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc12);
            doc_compression_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
              __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xc12,"void doc_compression_test()");
            }
          }
        }
        else {
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc0d);
            doc_compression_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xc0d,"void doc_compression_test()");
            }
          }
          iVar2 = memcmp(pvRam0000000000000038,
                         *(void **)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x38),
                         sRam0000000000000008);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                    *(undefined8 *)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x38),
                    pvRam0000000000000038,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc0e);
            doc_compression_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc0e,"void doc_compression_test()");
          }
          iVar2 = memcmp(pvRam0000000000000040,
                         *(void **)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x40),
                         sRam0000000000000010);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                    *(undefined8 *)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x40),
                    pvRam0000000000000040,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xc0f);
            doc_compression_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xc0f,"void doc_compression_test()");
          }
        }
        pvVar3 = (void *)0x115c66;
        fdb_doc_free((fdb_doc *)0x115c66);
        n = n + 1;
      } while( true );
    }
    fdb_doc_create(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                   (size_t)in_stack_fffffffffffff9b8,pvVar3,0,(void *)0x1157c6,
                   in_stack_fffffffffffff9e0);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
    if (n == 5) {
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbfa);
        doc_compression_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xbfa,"void doc_compression_test()");
        }
      }
    }
    else {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbf5);
        doc_compression_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xbf5,"void doc_compression_test()");
        }
      }
      iVar2 = memcmp(pvRam0000000000000038,
                     *(void **)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x38),
                     sRam0000000000000008);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x38),
                pvRam0000000000000038,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbf6);
        doc_compression_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xbf6,"void doc_compression_test()");
      }
      iVar2 = memcmp(pvRam0000000000000040,
                     *(void **)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x40),
                     sRam0000000000000010);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffff9b8 + (long)n * 8) + 0x40),
                pvRam0000000000000040,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xbf7);
        doc_compression_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xbf7,"void doc_compression_test()");
      }
    }
    pvVar3 = (void *)0x1159da;
    fdb_doc_free((fdb_doc *)0x1159da);
    n = n + 1;
  } while( true );
}

Assistant:

void doc_compression_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int dummy_len = 32;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compress_document_body = true;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set dummy str
    memset(temp, 'a', dummy_len);
    temp[dummy_len]=0;

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_%s", i, temp);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update dummy str
    dummy_len = 64;
    memset(temp, 'b', dummy_len);
    temp[dummy_len]=0;

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("document compression test");
}